

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O2

void __thiscall
banksia::UciEngine::parseLine(UciEngine *this,int cmdInt,string *cmdString,string *line)

{
  EngineComputingState __args_4;
  GameTimeController *this_00;
  bool bVar1;
  reference pvVar2;
  uint *__n;
  void *__buf;
  size_t i;
  ulong __n_00;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  value_type moveString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  Move local_78;
  double local_68;
  string ponderMoveString;
  Move local_40;
  
  if (-1 < cmdInt) {
    __n = &switchD_0015292a::switchdataD_001703cc;
    switch(cmdInt) {
    case 0:
      Player::setState((Player *)this,ready);
      this->expectingBestmove = false;
      (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x24])(this);
      (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x1f])(this);
      return;
    case 2:
      bVar1 = parseOption(this,line);
      if (!bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &moveRecv,"Unknown option ",line);
        Engine::write((Engine *)this,
                      (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &moveRecv,__buf,(size_t)__n);
        std::__cxx11::string::~string((string *)&moveRecv);
      }
      break;
    case 3:
      if ((this->super_EngineProfile).super_Engine.computingState == thinking) {
        parseInfo(this,line);
        return;
      }
      break;
    case 4:
      this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::function(&moveRecv,&(this->super_EngineProfile).super_Engine.super_Player.moveReceiver);
      if ((this_00 != (GameTimeController *)0x0) &&
         (CONCAT71(moveRecv.super__Function_base._M_manager._1_7_,
                   moveRecv.super__Function_base._M_manager._0_1_) != 0)) {
        this->expectingBestmove = false;
        __args_4 = (this->super_EngineProfile).super_Engine.computingState;
        (this->super_EngineProfile).super_Engine.computingState = idle;
        local_68 = GameTimeController::moveTimeConsumed(this_00);
        splitString(&vec,line,' ');
        if (0x20 < (ulong)((long)vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vec.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&vec,1);
          std::__cxx11::string::string((string *)&moveString,(string *)pvVar2);
          std::__cxx11::string::string((string *)&ponderMoveString,"",(allocator *)&local_78);
          if (0x60 < (ulong)((long)vec.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)vec.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&vec,2);
            bVar1 = std::operator==(pvVar2,"ponder");
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&vec,3);
              std::__cxx11::string::_M_assign((string *)&ponderMoveString);
            }
          }
          if ((moveString._M_string_length != 0) &&
             ((this->super_EngineProfile).super_Engine.super_Player.moveReceiver.
              super__Function_base._M_manager != (_Manager_type)0x0)) {
            local_78 = BoardCore::moveFromCoordiateString(&moveString);
            local_40 = BoardCore::moveFromCoordiateString(&ponderMoveString);
            std::
            function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
            ::operator()(&moveRecv,&local_78,&moveString,&local_40,local_68,__args_4);
          }
          std::__cxx11::string::~string((string *)&ponderMoveString);
          std::__cxx11::string::~string((string *)&moveString);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vec);
      }
      std::_Function_base::~_Function_base(&moveRecv.super__Function_base);
      break;
    case 5:
      splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&moveString,line,' ');
      if (0x40 < moveString._M_string_length - (long)moveString._M_dataplus._M_p) {
        moveRecv.super__Function_base._M_functor._M_unused._M_object =
             &moveRecv.super__Function_base._M_manager;
        moveRecv.super__Function_base._M_functor._8_8_ = 0;
        moveRecv.super__Function_base._M_manager._0_1_ = 0;
        for (__n_00 = 2;
            __n_00 < (ulong)((long)(moveString._M_string_length - (long)moveString._M_dataplus._M_p)
                            >> 5); __n_00 = __n_00 + 1) {
          if (moveRecv.super__Function_base._M_functor._8_8_ != 0) {
            std::__cxx11::string::append((char *)&moveRecv);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&moveString,__n_00);
          std::__cxx11::string::append((string *)&moveRecv);
        }
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&moveString,1);
        bVar1 = std::operator==(pvVar2,"name");
        if (bVar1) {
          std::__cxx11::string::_M_assign
                    ((string *)&(this->super_EngineProfile).super_Engine.config.idName);
        }
        std::__cxx11::string::~string((string *)&moveRecv);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&moveString);
    }
  }
  return;
}

Assistant:

void UciEngine::parseLine(int cmdInt, const std::string& cmdString, const std::string& line)
{
    if (cmdInt < 0) return;
    
    auto cmd = static_cast<UciEngineCmd>(cmdInt);
    switch (cmd) {
        case UciEngineCmd::option:
            if (!parseOption(line)) {
                write("Unknown option " + line);
            }
            break;
            
        case UciEngineCmd::info:
            if (computingState == EngineComputingState::thinking) {
                parseInfo(line);
            }
            break;
            
        case UciEngineCmd::bestmove:
        {
            auto timeCtrl = timeController;
            auto moveRecv = moveReceiver;
            if (timeCtrl == nullptr || moveRecv == nullptr) {
                return;
            }
            
            assert(expectingBestmove);
            assert(computingState != EngineComputingState::idle);
            
            expectingBestmove = false;
            auto oldComputingState = computingState;
            computingState = EngineComputingState::idle;
            
            auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
            
            auto vec = splitString(line, ' ');
            if (vec.size() < 2) {
                return;
            }
            auto moveString = vec.at(1);
            
            std::string ponderMoveString = "";
            if (vec.size() >= 4 && vec.at(2) == "ponder") {
                ponderMoveString = vec.at(3);
            }
            
            if (!moveString.empty() && moveReceiver != nullptr) {
                auto move = board->moveFromCoordiateString(moveString);
                auto ponderMove = board->moveFromCoordiateString(ponderMoveString);
                (moveRecv)(move, moveString, ponderMove, period, oldComputingState);
            }
            
            break;
        }

        case UciEngineCmd::uciok:
        {
            setState(PlayerState::ready);
            expectingBestmove = false;
            sendOptions();
            sendPing();
            break;
        }

        case UciEngineCmd::theId:
        {
            auto vec = splitString(line, ' ');
            if (vec.size() <= 2) {
                return;
            }
            
            std::string str;
            for(size_t i = 2; i < vec.size(); i++) {
                if (!str.empty()) str += " ";
                str += vec.at(i);
            }
            
            if (vec.at(1) == "name") { // name or author
                config.idName = str;
            }
            break;
        }
            
        default:
            break;
    }
}